

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O3

int32_t locale_canonKeywordName(char *buf,char *keywordName,UErrorCode *status)

{
  UBool UVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  
  cVar2 = *keywordName;
  if (cVar2 == '\0') {
LAB_00353742:
    *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_00353750:
    lVar3 = 0;
  }
  else {
    lVar4 = 0;
    do {
      UVar1 = uprv_isASCIILetter_63(cVar2);
      if ((UVar1 == '\0') && (9 < (byte)(keywordName[lVar4] - 0x30U))) goto LAB_00353742;
      if (lVar4 == 0x18) {
        *status = U_INTERNAL_PROGRAM_ERROR;
        goto LAB_00353750;
      }
      cVar2 = uprv_asciitolower_63(keywordName[lVar4]);
      lVar3 = lVar4 + 1;
      buf[lVar4] = cVar2;
      cVar2 = keywordName[lVar4 + 1];
      lVar4 = lVar3;
    } while (cVar2 != '\0');
    buf[lVar3] = '\0';
  }
  return (int32_t)lVar3;
}

Assistant:

static int32_t locale_canonKeywordName(char *buf, const char *keywordName, UErrorCode *status)
{
  int32_t keywordNameLen = 0;

  for (; *keywordName != 0; keywordName++) {
    if (!UPRV_ISALPHANUM(*keywordName)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed keyword name */
      return 0;
    }
    if (keywordNameLen < ULOC_KEYWORD_BUFFER_LEN - 1) {
      buf[keywordNameLen++] = uprv_tolower(*keywordName);
    } else {
      /* keyword name too long for internal buffer */
      *status = U_INTERNAL_PROGRAM_ERROR;
      return 0;
    }
  }
  if (keywordNameLen == 0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty keyword name */
    return 0;
  }
  buf[keywordNameLen] = 0; /* terminate */

  return keywordNameLen;
}